

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.h
# Opt level: O0

int sat_solver_add_xor(sat_solver *pSat,int iVarA,int iVarB,int iVarC,int fCompl)

{
  int iVar1;
  lit local_2c;
  int Cid;
  lit Lits [3];
  int fCompl_local;
  int iVarC_local;
  int iVarB_local;
  int iVarA_local;
  sat_solver *pSat_local;
  
  Lits[1] = fCompl;
  Lits[2] = iVarC;
  if (((iVarA < 0) || (iVarB < 0)) || (iVarC < 0)) {
    __assert_fail("iVarA >= 0 && iVarB >= 0 && iVarC >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                  ,0x1a8,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
  }
  local_2c = toLitCond(iVarA,(uint)((fCompl != 0 ^ 0xffU) & 1));
  Cid = toLitCond(iVarB,1);
  Lits[0] = toLitCond(Lits[2],1);
  iVar1 = sat_solver_addclause(pSat,&local_2c,Lits + 1);
  if (iVar1 == 0) {
    __assert_fail("Cid",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                  ,0x1ae,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
  }
  local_2c = toLitCond(iVarA,(uint)((Lits[1] != 0 ^ 0xffU) & 1));
  Cid = toLitCond(iVarB,0);
  Lits[0] = toLitCond(Lits[2],0);
  iVar1 = sat_solver_addclause(pSat,&local_2c,Lits + 1);
  if (iVar1 != 0) {
    local_2c = toLitCond(iVarA,Lits[1]);
    Cid = toLitCond(iVarB,1);
    Lits[0] = toLitCond(Lits[2],0);
    iVar1 = sat_solver_addclause(pSat,&local_2c,Lits + 1);
    if (iVar1 == 0) {
      __assert_fail("Cid",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                    ,0x1ba,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
    }
    local_2c = toLitCond(iVarA,Lits[1]);
    Cid = toLitCond(iVarB,0);
    Lits[0] = toLitCond(Lits[2],1);
    iVar1 = sat_solver_addclause(pSat,&local_2c,Lits + 1);
    if (iVar1 != 0) {
      return 4;
    }
    __assert_fail("Cid",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                  ,0x1c0,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
  }
  __assert_fail("Cid",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                ,0x1b4,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
}

Assistant:

static inline int sat_solver_add_xor( sat_solver * pSat, int iVarA, int iVarB, int iVarC, int fCompl )
{
    lit Lits[3];
    int Cid;
    assert( iVarA >= 0 && iVarB >= 0 && iVarC >= 0 );

    Lits[0] = toLitCond( iVarA, !fCompl );
    Lits[1] = toLitCond( iVarB, 1 );
    Lits[2] = toLitCond( iVarC, 1 );
    Cid = sat_solver_addclause( pSat, Lits, Lits + 3 );
    assert( Cid );

    Lits[0] = toLitCond( iVarA, !fCompl );
    Lits[1] = toLitCond( iVarB, 0 );
    Lits[2] = toLitCond( iVarC, 0 );
    Cid = sat_solver_addclause( pSat, Lits, Lits + 3 );
    assert( Cid );

    Lits[0] = toLitCond( iVarA, fCompl );
    Lits[1] = toLitCond( iVarB, 1 );
    Lits[2] = toLitCond( iVarC, 0 );
    Cid = sat_solver_addclause( pSat, Lits, Lits + 3 );
    assert( Cid );

    Lits[0] = toLitCond( iVarA, fCompl );
    Lits[1] = toLitCond( iVarB, 0 );
    Lits[2] = toLitCond( iVarC, 1 );
    Cid = sat_solver_addclause( pSat, Lits, Lits + 3 );
    assert( Cid );
    return 4;
}